

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O2

void __thiscall QBalloonTip::paintEvent(QBalloonTip *this,QPaintEvent *param_1)

{
  long in_FS_OFFSET;
  QPainter painter;
  QRect local_30;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_20,&(this->super_QWidget).super_QPaintDevice);
  local_30 = QWidget::rect(&this->super_QWidget);
  QPainter::drawPixmap((QPainter *)&local_20,&local_30,&this->pixmap);
  QPainter::~QPainter((QPainter *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBalloonTip::paintEvent(QPaintEvent *)
{
    QPainter painter(this);
    painter.drawPixmap(rect(), pixmap);
}